

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_parser.hpp
# Opt level: O3

path_expression_type * __thiscall
jsoncons::jsonpath::detail::
jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
::compile(path_expression_type *__return_storage_ptr__,
         jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
         *this,static_resources<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               *resources,string_view_type *path)

{
  system_error *this_00;
  undefined8 extraout_RAX;
  error_code __ec;
  error_code ec;
  error_code local_48;
  size_t local_38;
  size_t sStack_30;
  
  local_48._M_value = 0;
  local_48._M_cat = (error_category *)std::_V2::system_category();
  compile(__return_storage_ptr__,this,resources,path,&local_48);
  if (local_48._M_value == 0) {
    return __return_storage_ptr__;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x58);
  __ec._4_4_ = 0;
  __ec._M_value = local_48._M_value;
  local_38 = this->line_;
  sStack_30 = this->column_;
  *(undefined ***)(this_00 + 0x50) = &PTR__json_exception_00b2f248;
  __ec._M_cat = local_48._M_cat;
  std::system_error::system_error(this_00,__ec);
  jsonpath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
  ::compile();
  __cxa_free_exception(this_00);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

path_expression_type compile(static_resources<value_type>& resources, const string_view_type& path)
        {
            std::error_code ec;
            auto result = compile(resources, path, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(jsonpath_error(ec, line_, column_));
            }
            return result;
        }